

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O0

bool __thiscall
draco::GeometryAttribute::ConvertValue<float>
          (GeometryAttribute *this,AttributeValueIndex att_id,int8_t out_num_components,
          float *out_val)

{
  long in_RCX;
  AttributeValueIndex in_ESI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc4;
  uint8_t out_num_components_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  AttributeValueIndex in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint8_t out_num_components_01;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  AttributeValueIndex att_id_00;
  bool local_1;
  
  if (in_RCX == 0) {
    local_1 = false;
  }
  else {
    out_num_components_00 = (uint8_t)((uint)in_stack_ffffffffffffffc4 >> 0x18);
    out_num_components_01 = (uint8_t)((uint)in_stack_ffffffffffffffd4 >> 0x18);
    att_id_00.value_ = (uint)in_RCX;
    switch(*(undefined4 *)(in_RDI + 0x1c)) {
    case 1:
      local_1 = ConvertTypedValue<signed_char,float>
                          ((GeometryAttribute *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           in_stack_ffffffffffffffd0,out_num_components_00,
                           (float *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      break;
    case 2:
      local_1 = ConvertTypedValue<unsigned_char,float>
                          ((GeometryAttribute *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           in_stack_ffffffffffffffd0,out_num_components_00,
                           (float *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      break;
    case 3:
      local_1 = ConvertTypedValue<short,float>
                          ((GeometryAttribute *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           in_stack_ffffffffffffffd0,out_num_components_00,
                           (float *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      break;
    case 4:
      local_1 = ConvertTypedValue<unsigned_short,float>
                          ((GeometryAttribute *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),in_ESI,
                           out_num_components_00,
                           (float *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      break;
    case 5:
      local_1 = ConvertTypedValue<int,float>
                          ((GeometryAttribute *)CONCAT44(in_ESI.value_,in_stack_ffffffffffffffc8),
                           in_stack_ffffffffffffffd0,out_num_components_00,
                           (float *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      break;
    case 6:
      local_1 = ConvertTypedValue<unsigned_int,float>
                          ((GeometryAttribute *)CONCAT44(in_stack_ffffffffffffffcc,in_ESI.value_),
                           in_stack_ffffffffffffffd0,out_num_components_00,
                           (float *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      break;
    case 7:
      local_1 = ConvertTypedValue<long,float>
                          ((GeometryAttribute *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),att_id_00,
                           out_num_components_01,
                           (float *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      break;
    case 8:
      local_1 = ConvertTypedValue<unsigned_long,float>
                          ((GeometryAttribute *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),att_id_00,
                           out_num_components_01,
                           (float *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      break;
    case 9:
      local_1 = ConvertTypedValue<float,float>
                          ((GeometryAttribute *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           in_stack_ffffffffffffffd0,out_num_components_00,
                           (float *)CONCAT44(in_ESI.value_,in_stack_ffffffffffffffb8));
      break;
    case 10:
      local_1 = ConvertTypedValue<double,float>
                          ((GeometryAttribute *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),att_id_00,
                           out_num_components_01,
                           (float *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      break;
    case 0xb:
      local_1 = ConvertTypedValue<bool,float>
                          ((GeometryAttribute *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           in_stack_ffffffffffffffd0,out_num_components_00,
                           (float *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      break;
    default:
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool ConvertValue(AttributeValueIndex att_id, int8_t out_num_components,
                    OutT *out_val) const {
    if (out_val == nullptr) {
      return false;
    }
    switch (data_type_) {
      case DT_INT8:
        return ConvertTypedValue<int8_t, OutT>(att_id, out_num_components,
                                               out_val);
      case DT_UINT8:
        return ConvertTypedValue<uint8_t, OutT>(att_id, out_num_components,
                                                out_val);
      case DT_INT16:
        return ConvertTypedValue<int16_t, OutT>(att_id, out_num_components,
                                                out_val);
      case DT_UINT16:
        return ConvertTypedValue<uint16_t, OutT>(att_id, out_num_components,
                                                 out_val);
      case DT_INT32:
        return ConvertTypedValue<int32_t, OutT>(att_id, out_num_components,
                                                out_val);
      case DT_UINT32:
        return ConvertTypedValue<uint32_t, OutT>(att_id, out_num_components,
                                                 out_val);
      case DT_INT64:
        return ConvertTypedValue<int64_t, OutT>(att_id, out_num_components,
                                                out_val);
      case DT_UINT64:
        return ConvertTypedValue<uint64_t, OutT>(att_id, out_num_components,
                                                 out_val);
      case DT_FLOAT32:
        return ConvertTypedValue<float, OutT>(att_id, out_num_components,
                                              out_val);
      case DT_FLOAT64:
        return ConvertTypedValue<double, OutT>(att_id, out_num_components,
                                               out_val);
      case DT_BOOL:
        return ConvertTypedValue<bool, OutT>(att_id, out_num_components,
                                             out_val);
      default:
        // Wrong attribute type.
        return false;
    }
  }